

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::FillerParameter::ByteSizeLong(FillerParameter *this)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  undefined4 in_ESI;
  undefined1 auVar10 [16];
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->type_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    auVar10._0_4_ = -(uint)((uVar1 & 0x10) == 0);
    auVar10._4_4_ = -(uint)((uVar1 & 8) == 0);
    auVar10._8_4_ = -(uint)((uVar1 & 4) == 0);
    auVar10._12_4_ = -(uint)((uVar1 & 2) == 0);
    uVar7 = movmskps(in_ESI,auVar10);
    sVar6 = sVar5 + 5;
    if ((uVar7 & 8) != 0) {
      sVar6 = sVar5;
    }
    sVar5 = sVar6 + 5;
    if ((uVar7 & 4) != 0) {
      sVar5 = sVar6;
    }
    sVar6 = sVar5 + 5;
    if ((uVar7 & 2) != 0) {
      sVar6 = sVar5;
    }
    if ((uVar7 & 1) == 0) {
      if (this->variance_norm_ < 0) {
        uVar8 = 0xb;
      }
      else {
        uVar7 = this->variance_norm_ | 1;
        iVar4 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar8 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar8;
    }
    if ((uVar1 & 0x20) != 0) {
      if (this->sparse_ < 0) {
        uVar8 = 0xb;
      }
      else {
        uVar7 = this->sparse_ | 1;
        iVar4 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar8 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar6 = sVar6 + uVar8;
    }
    sVar9 = sVar6 + 5;
    if ((uVar1 & 0x40) == 0) {
      sVar9 = sVar6;
    }
    sVar5 = sVar9 + 5;
    if (-1 < (char)uVar1) {
      sVar5 = sVar9;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t FillerParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.FillerParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string type = 1 [default = "constant"];
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional float value = 2 [default = 0];
    if (has_value()) {
      total_size += 1 + 4;
    }

    // optional float min = 3 [default = 0];
    if (has_min()) {
      total_size += 1 + 4;
    }

    // optional float mean = 5 [default = 0];
    if (has_mean()) {
      total_size += 1 + 4;
    }

    // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
    if (has_variance_norm()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->variance_norm());
    }

    // optional int32 sparse = 7 [default = -1];
    if (has_sparse()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->sparse());
    }

    // optional float max = 4 [default = 1];
    if (has_max()) {
      total_size += 1 + 4;
    }

    // optional float std = 6 [default = 1];
    if (has_std()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}